

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Json *pJVar4;
  Value *root;
  char *value_00;
  LargestUInt value_01;
  char *value_02;
  LargestInt value_03;
  char *pcVar5;
  pointer pbVar6;
  double value_04;
  Members members;
  string local_68;
  Members local_48;
  
  switch(value->field_0x8) {
  case 0:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"null","");
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_0010e9f5;
  case 1:
    pJVar4 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_03);
    pushValue(this,&local_68);
    break;
  case 2:
    pJVar4 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar4,value_01);
    pushValue(this,&local_68);
    break;
  case 3:
    value_04 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)value,value_04);
    pushValue(this,&local_68);
    break;
  case 4:
    pJVar4 = (Json *)Value::asCString(value);
    valueToQuotedString_abi_cxx11_(&local_68,pJVar4,value_00);
    pushValue(this,&local_68);
    break;
  case 5:
    bVar3 = Value::asBool(value);
    pcVar5 = "false";
    if (bVar3) {
      pcVar5 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar5,pcVar5 + ((ulong)bVar3 ^ 5));
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_0010e9f5;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    paVar2 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar2;
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{}","");
      pushValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) goto LAB_0010eacb;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
      writeIndent(this);
      psVar1 = &this->document_;
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      indent(this);
      pbVar6 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        root = Value::operator[](value,(pbVar6->_M_dataplus)._M_p);
        writeCommentBeforeValue(this,root);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(pbVar6->_M_dataplus)._M_p,value_02);
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)psVar1);
        writeValue(this,root);
        pbVar6 = pbVar6 + 1;
        if (pbVar6 == local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
        std::__cxx11::string::append((char *)psVar1);
        writeCommentAfterValueOnSameLine(this,root);
      }
      writeCommentAfterValueOnSameLine(this,root);
      unindent(this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"}","");
      writeIndent(this);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0010eacb:
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  default:
    goto switchD_0010e7f0_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0010e9f5:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
switchD_0010e7f0_default:
  return;
}

Assistant:

ValueType Value::type() const { return type_; }